

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O1

bool __thiscall
tinyusdz::ascii::AsciiParser::ReadBasicType
          (AsciiParser *this,optional<tinyusdz::value::texcoord2d> *value)

{
  bool bVar1;
  bool bVar2;
  double2 v;
  array<double,_2UL> local_20;
  
  bVar1 = MaybeNone(this);
  if (bVar1) {
    bVar1 = true;
    bVar2 = false;
  }
  else {
    bVar1 = ParseBasicTypeTuple<double,2ul>(this,&local_20);
    if (!bVar1) {
      return bVar1;
    }
    *(double *)&value->contained = local_20._M_elems[0];
    *(double *)((long)&value->contained + 8) = local_20._M_elems[1];
    bVar2 = true;
    if (value->has_value_ != false) {
      return bVar1;
    }
  }
  value->has_value_ = bVar2;
  return bVar1;
}

Assistant:

bool AsciiParser::ReadBasicType(nonstd::optional<value::texcoord2d> *value) {
  if (MaybeNone()) {
    (*value) = nonstd::nullopt;
    return true;
  }

  value::texcoord2d v;
  if (ReadBasicType(&v)) {
    (*value) = v;
    return true;
  }

  return false;
}